

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

size_t * __thiscall
andres::
BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>
::shapeEnd(BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>
           *this)

{
  size_t *psVar1;
  BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>
  *this_local;
  
  psVar1 = View<float,_true,_std::allocator<unsigned_long>_>::shapeEnd(this->e_);
  return psVar1;
}

Assistant:

const std::size_t* shapeEnd() const 
        { return e_.shapeEnd(); }